

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O0

bool __thiscall Writer::isFunctionPrinted(Writer *this,Func *func)

{
  bool bVar1;
  size_type sVar2;
  long in_RSI;
  string *in_RDI;
  char *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = isCFunc(in_RDI);
  if ((((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8), bVar1)) ||
      (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8), bVar1)) ||
     ((bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8), bVar1 ||
      (bVar1 = isCMath(in_RDI), bVar1)))) {
    local_1 = false;
  }
  else {
    if ((in_RDI[1]._M_string_length & 1) == 0) {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
      if ((((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8), bVar1)) ||
          (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8), bVar1)) &&
         (sVar2 = std::vector<Value_*,_std::allocator<Value_*>_>::size
                            ((vector<Value_*,_std::allocator<Value_*>_> *)(in_RSI + 0x70)),
         3 < sVar2)) {
        return false;
      }
    }
    else {
      bVar1 = isStdLibFunc(in_RDI);
      if ((((bVar1) || (bVar1 = isStringFunc(in_RDI), bVar1)) ||
          (bVar1 = isStdioFunc(in_RDI), bVar1)) || (bVar1 = isPthreadFunc(in_RDI), bVar1)) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Writer::isFunctionPrinted(const Func* func) const {
    if (isCFunc(func->name) || func->name == "va_start" || func->name == "va_end" || func->name == "va_copy" || isCMath(func->name)) {
        return false;
    }

    if (useIncludes) {
        if (isStdLibFunc(func->name) || isStringFunc(func->name) || isStdioFunc(func->name) || isPthreadFunc(func->name)) {
            return false;
        }
    } else {
        if ((func->name == "memcpy" || func->name == "memset" || func->name == "memmove") && func->parameters.size() > 3) {
            return false;
        }
    }

    return true;
}